

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmFMove<(moira::Instr)192,(moira::Mode)1,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  int iVar2;
  Syntax SVar3;
  char *pcVar4;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  long lVar8;
  char cVar9;
  Fp fp;
  uint ext;
  Ffmt ffmt;
  An an;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar7 = (*this->_vptr_Moira[6])();
  ext = uVar7 & 0xffff;
  if (((str->style->syntax & ~MOIRA_MIT) == GNU) &&
     (bVar6 = isValidExtFPU((Moira *)(ulong)ext,FMOVE,AN,op,ext), !bVar6)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)192,(moira::Mode)1,0>(this,str,addr,op);
    return;
  }
  an.raw = op & 7;
  uVar5 = ext >> 0xd;
  ffmt.raw = ext >> 10 & 7;
  fp.raw = ext >> 7 & 7;
  if (uVar5 != 3) {
    uVar7 = uVar7 & 0x7f;
    if (uVar5 == 2) {
      cVar9 = 'f';
      lVar8 = 1;
      if (uVar7 == 0x40) {
        do {
          pcVar4 = str->ptr;
          str->ptr = pcVar4 + 1;
          *pcVar4 = cVar9;
          cVar9 = "fsmove"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 7);
      }
      else if (uVar7 == 0x44) {
        do {
          pcVar4 = str->ptr;
          str->ptr = pcVar4 + 1;
          *pcVar4 = cVar9;
          cVar9 = "fdmove"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 7);
      }
      else {
        do {
          pcVar4 = str->ptr;
          str->ptr = pcVar4 + 1;
          *pcVar4 = cVar9;
          cVar9 = "fmove"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 6);
      }
      StrWriter::operator<<(str,ffmt);
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = ' ';
      }
      else {
        iVar2 = (str->tab).raw;
        do {
          pcVar4 = str->ptr;
          str->ptr = pcVar4 + 1;
          *pcVar4 = ' ';
        } while (str->ptr < str->base + iVar2);
      }
      StrWriter::operator<<(str,an);
    }
    else {
      if (uVar5 != 0) {
        return;
      }
      cVar9 = 'f';
      lVar8 = 1;
      if (uVar7 == 0x40) {
        do {
          pcVar4 = str->ptr;
          str->ptr = pcVar4 + 1;
          *pcVar4 = cVar9;
          cVar9 = "fsmove"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 7);
      }
      else if (uVar7 == 0x44) {
        do {
          pcVar4 = str->ptr;
          str->ptr = pcVar4 + 1;
          *pcVar4 = cVar9;
          cVar9 = "fdmove"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 7);
      }
      else {
        do {
          pcVar4 = str->ptr;
          str->ptr = pcVar4 + 1;
          *pcVar4 = cVar9;
          cVar9 = "fmove"[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 6);
      }
      StrWriter::operator<<(str,(Ffmt)0x2);
      if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = ' ';
      }
      else {
        iVar2 = (str->tab).raw;
        do {
          pcVar4 = str->ptr;
          str->ptr = pcVar4 + 1;
          *pcVar4 = ' ';
        } while (str->ptr < str->base + iVar2);
      }
      StrWriter::operator<<(str,(Fp)ffmt.raw);
    }
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ',';
    SVar3 = str->style->syntax;
    if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
    }
    StrWriter::operator<<(str,fp);
    return;
  }
  if (ffmt.raw == 3) {
    cVar9 = 'f';
    lVar8 = 1;
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar9;
      cVar9 = "fmove"[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 6);
    StrWriter::operator<<(str,(Ffmt)0x3);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
    }
    else {
      iVar2 = (str->tab).raw;
      do {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = ' ';
      } while (str->ptr < str->base + iVar2);
    }
    StrWriter::operator<<(str,fp);
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ',';
    SVar3 = str->style->syntax;
    if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
    }
    StrWriter::operator<<(str,an);
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = '{';
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = '#';
    StrWriter::operator<<(str,(Int)((int)(ext << 0x19) >> 0x19));
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = '}';
    return;
  }
  if (ffmt.raw == 7) {
    cVar9 = 'f';
    lVar8 = 1;
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar9;
      cVar9 = "fmove"[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 6);
    StrWriter::operator<<(str,(Ffmt)0x3);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
    }
    else {
      iVar2 = (str->tab).raw;
      do {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = ' ';
      } while (str->ptr < str->base + iVar2);
    }
    StrWriter::operator<<(str,fp);
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ',';
    SVar3 = str->style->syntax;
    if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
    }
    StrWriter::operator<<(str,an);
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ',';
    SVar3 = str->style->syntax;
    if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
    }
    StrWriter::operator<<(str,(Dn)(ext >> 4 & 7));
    return;
  }
  cVar9 = 'f';
  lVar8 = 1;
  do {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = cVar9;
    cVar9 = "fmove"[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 6);
  StrWriter::operator<<(str,ffmt);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ' ';
  }
  else {
    iVar2 = (str->tab).raw;
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
    } while (str->ptr < str->base + iVar2);
  }
  StrWriter::operator<<(str,fp);
  pcVar4 = str->ptr;
  str->ptr = pcVar4 + 1;
  *pcVar4 = ',';
  SVar3 = str->style->syntax;
  if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ' ';
  }
  StrWriter::operator<<(str,an);
  return;
}

Assistant:

void
Moira::dasmFMove(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead(addr);
    auto reg = _____________xxx (op);
    auto cod = xxx_____________ (ext);
    auto src = ___xxx__________ (ext);
    auto dst = ______xxx_______ (ext);
    auto fac = _________xxxxxxx (ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtFPU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    switch (cod) {

        case 0b000:

            if (fac == 0x40) str << Ins<Instr::FSMOVE>{} << Ffmt{2};
            else if (fac == 0x44) str << Ins<Instr::FDMOVE>{} << Ffmt{2};
            else str << Ins<I>{} << Ffmt{2};

            str << str.tab << Fp(src) << Sep{} << Fp(dst);
            break;

        case 0b010:

            if (fac == 0x40) str << Ins<Instr::FSMOVE>{} << Ffmt{src};
            else if (fac == 0x44) str << Ins<Instr::FDMOVE>{} << Ffmt{src};
            else str << Ins<I>{} << Ffmt{src};

            if (M == Mode::IM) {

                u64 val;

                switch (src) {

                    case 0: // Long-Word Integer
                        val = dasmIncRead<Long>(addr);
                        str << str.tab << Ims<Long>(u32(val)) << Sep{} << Fp(dst);
                        break;

                    case 1: // Single precision

                        val = dasmIncRead<Long>(addr);
                        str << str.tab << "#<fixme>" << Sep{} << Fp(dst);
                        break;

                    case 2: // Double precision
                    case 3: // Packed-Decimal Real

                        val = dasmIncRead<Long>(addr);
                        dasmIncRead<Long>(addr);
                        dasmIncRead<Long>(addr); // Why???
                        str << str.tab << "#<fixme>" << Sep{} << Fp(dst);
                        break;

                    case 5: // Double-precision real

                        val = dasmIncRead<Long>(addr);
                        dasmIncRead<Long>(addr);
                        str << str.tab << "#<fixme>" << Sep{} << Fp(dst);
                        break;

                    case 6: // Byte Integer
                        val = dasmIncRead<Word>(addr);
                        str << str.tab << Ims<Byte>(u32(val)) << Sep{} << Fp(dst);
                        break;

                    default:
                        str << str.tab << Op<M, Word>(reg, addr) << Sep{} << Fp(dst);
                }
            } else {
                str << str.tab << Op<M, Long>(reg, addr) << Sep{} << Fp(dst);
            }
            break;

        case 0b011:

            switch (src) {

                case 0b011:

                    str << Ins<I>{} << Ffmt{src} << str.tab << Fp(dst) << Sep{} << Op<M, Long>(reg, addr);
                    str << "{" << Ims<Byte>(i8(fac << 1) >> 1) << "}";
                    break;

                case 0b111:

                    str << Ins<I>{} << Ffmt{3} << str.tab << Fp{dst} << Sep{} << Op<M, Long>(reg, addr);
                    str << Sep{} << Dn(fac >> 4);
                    break;

                default:

                    str << Ins<I>{} << Ffmt{src} << str.tab << Fp{dst} << Sep{} << Op<M, Long>(reg, addr);
                    break;
            }
            break;
    }
}